

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int is_put_or_delete_method(mg_connection *conn)

{
  char *__s1;
  int iVar1;
  uint unaff_EBP;
  
  if (conn != (mg_connection *)0x0) {
    __s1 = (conn->request_info).request_method;
    if (__s1 != (char *)0x0) {
      iVar1 = strcmp(__s1,"PUT");
      unaff_EBP = 1;
      if (((((iVar1 != 0) && (iVar1 = strcmp(__s1,"DELETE"), iVar1 != 0)) &&
           (iVar1 = strcmp(__s1,"MKCOL"), iVar1 != 0)) &&
          ((iVar1 = strcmp(__s1,"PATCH"), iVar1 != 0 && (iVar1 = strcmp(__s1,"LOCK"), iVar1 != 0))))
         && ((iVar1 = strcmp(__s1,"UNLOCK"), iVar1 != 0 &&
             ((iVar1 = strcmp(__s1,"PROPPATCH"), iVar1 != 0 &&
              (iVar1 = strcmp(__s1,"MOVE"), iVar1 != 0)))))) {
        iVar1 = strcmp(__s1,"COPY");
        unaff_EBP = (uint)(iVar1 == 0);
      }
    }
    if (__s1 != (char *)0x0) {
      return unaff_EBP;
    }
  }
  return 0;
}

Assistant:

static int
is_put_or_delete_method(const struct mg_connection *conn)
{
	if (conn) {
		const char *s = conn->request_info.request_method;
		if (s != NULL) {
			/* PUT, DELETE, MKCOL, PATCH, LOCK, UNLOCK, PROPPATCH, MOVE, COPY */
			return (!strcmp(s, "PUT") || !strcmp(s, "DELETE")
			        || !strcmp(s, "MKCOL") || !strcmp(s, "PATCH")
			        || !strcmp(s, "LOCK") || !strcmp(s, "UNLOCK")
			        || !strcmp(s, "PROPPATCH") || !strcmp(s, "MOVE")
			        || !strcmp(s, "COPY"));
		}
	}
	return 0;
}